

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::CollapseButton(ImGuiID id,ImVec2 *pos)

{
  float fVar1;
  ImVec2 IVar2;
  ImGuiWindow *window;
  float fVar3;
  float fVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  ImU32 col;
  ImU32 col_00;
  ImGuiCol idx;
  ImVec2 pos_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool hovered;
  bool held;
  ImVec2 center;
  ImRect bb;
  bool local_42;
  bool local_41;
  ImVec2 local_40;
  ImRect local_38;
  
  pIVar5 = GImGui;
  window = GImGui->CurrentWindow;
  fVar1 = GImGui->FontSize;
  IVar2 = (GImGui->Style).FramePadding;
  fVar3 = IVar2.x;
  fVar4 = IVar2.y;
  auVar8._0_4_ = fVar1 + (*pos).x + fVar3 + fVar3;
  auVar8._4_4_ = fVar1 + (*pos).y + fVar4 + fVar4;
  auVar8._8_4_ = fVar1 + 0.0 + 0.0;
  auVar8._12_4_ = fVar1 + 0.0 + 0.0;
  local_38.Min = *pos;
  local_38.Max = (ImVec2)vmovlps_avx(auVar8);
  ItemAdd(&local_38,id,(ImRect *)0x0);
  bVar6 = ButtonBehavior(&local_38,id,&local_42,&local_41,0);
  if ((local_41 != true) || (idx = 0x17, local_42 == false)) {
    idx = local_42 + 0x15;
  }
  col = GetColorU32(idx,1.0);
  col_00 = GetColorU32(0,1.0);
  auVar9._0_4_ = (local_38.Min.x + local_38.Max.x) * 0.5;
  auVar9._4_4_ = (local_38.Min.y + local_38.Max.y) * 0.5;
  auVar9._8_8_ = 0;
  local_40 = (ImVec2)vmovlps_avx(auVar9);
  if ((local_42 != false) || (local_41 == true)) {
    ImDrawList::AddCircleFilled(window->DrawList,&local_40,pIVar5->FontSize * 0.5 + 1.0,col,0xc);
  }
  IVar2 = (pIVar5->Style).FramePadding;
  pos_00.x = local_38.Min.x + IVar2.x;
  pos_00.y = local_38.Min.y + IVar2.y;
  RenderArrow(window->DrawList,pos_00,col_00,(window->Collapsed ^ 1) * 2 + 1,1.0);
  bVar7 = IsItemActive();
  if (bVar7) {
    bVar7 = IsMouseDragging(0,-1.0);
    if (bVar7) {
      StartMouseMovingWindow(window);
    }
  }
  return bVar6;
}

Assistant:

bool ImGui::CollapseButton(ImGuiID id, const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ItemAdd(bb, id);
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_None);

    // Render
    ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    ImVec2 center = bb.GetCenter();
    if (hovered || held)
        window->DrawList->AddCircleFilled(center/*+ ImVec2(0.0f, -0.5f)*/, g.FontSize * 0.5f + 1.0f, bg_col, 12);
    RenderArrow(window->DrawList, bb.Min + g.Style.FramePadding, text_col, window->Collapsed ? ImGuiDir_Right : ImGuiDir_Down, 1.0f);

    // Switch to moving the window after mouse is moved beyond the initial drag threshold
    if (IsItemActive() && IsMouseDragging(0))
        StartMouseMovingWindow(window);

    return pressed;
}